

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O2

boolean process_restart(j_decompress_ptr cinfo)

{
  uint *puVar1;
  jpeg_marker_reader *pjVar2;
  jpeg_entropy_decoder *pjVar3;
  boolean bVar4;
  long lVar5;
  
  pjVar2 = cinfo->marker;
  pjVar3 = cinfo->entropy;
  puVar1 = &pjVar2->discarded_bytes;
  *puVar1 = *puVar1 + *(int *)&pjVar3[1].decode_mcu / 8;
  *(undefined4 *)&pjVar3[1].decode_mcu = 0;
  bVar4 = (*pjVar2->read_restart_marker)(cinfo);
  if (bVar4 == 0) {
    bVar4 = 0;
  }
  else {
    for (lVar5 = 0; lVar5 < cinfo->comps_in_scan; lVar5 = lVar5 + 1) {
      *(undefined4 *)(&pjVar3[1].field_0x14 + lVar5 * 4) = 0;
    }
    pjVar3[1].insufficient_data = 0;
    *(uint *)((long)&pjVar3[2].decode_mcu + 4) = cinfo->restart_interval;
    bVar4 = 1;
    if (cinfo->unread_marker == 0) {
      pjVar3->insufficient_data = 0;
    }
  }
  return bVar4;
}

Assistant:

LOCAL(void)
process_restart(j_decompress_ptr cinfo)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  int ci;
  jpeg_component_info *compptr;

  /* Advance past the RSTn marker */
  if (!(*cinfo->marker->read_restart_marker) (cinfo))
    ERREXIT(cinfo, JERR_CANT_SUSPEND);

  /* Re-initialize statistics areas */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    if (!cinfo->progressive_mode || (cinfo->Ss == 0 && cinfo->Ah == 0)) {
      MEMZERO(entropy->dc_stats[compptr->dc_tbl_no], DC_STAT_BINS);
      /* Reset DC predictions to 0 */
      entropy->last_dc_val[ci] = 0;
      entropy->dc_context[ci] = 0;
    }
    if (!cinfo->progressive_mode || cinfo->Ss) {
      MEMZERO(entropy->ac_stats[compptr->ac_tbl_no], AC_STAT_BINS);
    }
  }

  /* Reset arithmetic decoding variables */
  entropy->c = 0;
  entropy->a = 0;
  entropy->ct = -16;    /* force reading 2 initial bytes to fill C */

  /* Reset restart counter */
  entropy->restarts_to_go = cinfo->restart_interval;
}